

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxBoxDetector.cpp
# Opt level: O3

void __thiscall
cbtBoxBoxDetector::getClosestPoints
          (cbtBoxBoxDetector *this,ClosestPointInput *input,Result *output,cbtIDebugDraw *param_3,
          bool param_4)

{
  undefined8 uVar1;
  cbtBoxShape *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  float fVar13;
  float fVar14;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int return_code;
  cbtScalar depth;
  dMatrix3 R2;
  dMatrix3 R1;
  cbtVector3 normal;
  dContactGeom *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  float local_d8;
  float fStack_d4;
  int local_c0;
  cbtScalar local_bc;
  cbtScalar local_b8 [2];
  cbtScalar acStack_b0 [10];
  undefined8 local_88;
  undefined4 auStack_80 [10];
  cbtVector3 local_58;
  cbtVector3 local_48;
  cbtVector3 local_38;
  
  lVar5 = 0;
  do {
    *(undefined8 *)((long)auStack_80 + lVar5 + -8) =
         *(undefined8 *)((long)(input->m_transformA).m_basis.m_el[0].m_floats + lVar5);
    *(undefined8 *)((long)acStack_b0 + lVar5 + -8) =
         *(undefined8 *)((long)(input->m_transformB).m_basis.m_el[0].m_floats + lVar5);
    *(undefined4 *)((long)auStack_80 + lVar5) =
         *(undefined4 *)((long)(input->m_transformA).m_basis.m_el[0].m_floats + lVar5 + 8);
    *(undefined4 *)((long)acStack_b0 + lVar5) =
         *(undefined4 *)((long)(input->m_transformB).m_basis.m_el[0].m_floats + lVar5 + 8);
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x30);
  pcVar2 = this->m_box1;
  uVar1 = *(undefined8 *)
           (pcVar2->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
           m_implicitShapeDimensions.m_floats;
  fVar13 = (pcVar2->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
           m_implicitShapeDimensions.m_floats[2];
  uVar8 = 0;
  uVar9 = 0;
  uVar10 = 0;
  fVar6 = fVar13;
  (*(pcVar2->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(pcVar2);
  fVar14 = fVar6;
  (*(pcVar2->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(pcVar2);
  fVar7 = fVar14;
  (*(pcVar2->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(pcVar2);
  auVar3._4_4_ = uVar8;
  auVar3._0_4_ = fVar6;
  auVar3._8_4_ = uVar9;
  auVar3._12_4_ = uVar10;
  fVar7 = fVar7 + fVar13;
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar14),0x10);
  local_d8 = (float)uVar1;
  fStack_d4 = (float)((ulong)uVar1 >> 0x20);
  local_d8 = auVar3._0_4_ + local_d8;
  fStack_d4 = auVar3._4_4_ + fStack_d4;
  fVar13 = auVar3._8_4_ + 0.0;
  fVar14 = auVar3._12_4_ + 0.0;
  auVar11._0_4_ = local_d8 + local_d8;
  auVar11._4_4_ = fStack_d4 + fStack_d4;
  auVar11._8_4_ = fVar13 + fVar13;
  auVar11._12_4_ = fVar14 + fVar14;
  local_48.m_floats = (cbtScalar  [4])vinsertps_avx(auVar11,ZEXT416((uint)(fVar7 + fVar7)),0x28);
  pcVar2 = this->m_box2;
  uVar1 = *(undefined8 *)
           (pcVar2->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
           m_implicitShapeDimensions.m_floats;
  fVar13 = (pcVar2->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.
           m_implicitShapeDimensions.m_floats[2];
  uVar8 = 0;
  uVar9 = 0;
  uVar10 = 0;
  fVar6 = fVar13;
  (*(pcVar2->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(pcVar2);
  fVar14 = fVar6;
  (*(pcVar2->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(pcVar2);
  fVar7 = fVar14;
  (*(pcVar2->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
    super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(pcVar2);
  auVar4._4_4_ = uVar8;
  auVar4._0_4_ = fVar6;
  auVar4._8_4_ = uVar9;
  auVar4._12_4_ = uVar10;
  fVar7 = fVar7 + fVar13;
  auVar3 = vinsertps_avx(auVar4,ZEXT416((uint)fVar14),0x10);
  local_d8 = (float)uVar1;
  fStack_d4 = (float)((ulong)uVar1 >> 0x20);
  local_d8 = auVar3._0_4_ + local_d8;
  fStack_d4 = auVar3._4_4_ + fStack_d4;
  fVar13 = auVar3._8_4_ + 0.0;
  fVar14 = auVar3._12_4_ + 0.0;
  auVar12._0_4_ = local_d8 + local_d8;
  auVar12._4_4_ = fStack_d4 + fStack_d4;
  auVar12._8_4_ = fVar13 + fVar13;
  auVar12._12_4_ = fVar14 + fVar14;
  local_58.m_floats = (cbtScalar  [4])vinsertps_avx(auVar12,ZEXT416((uint)(fVar7 + fVar7)),0x28);
  dBoxBox2(&(input->m_transformA).m_origin,(cbtScalar *)&local_88,&local_48,
           &(input->m_transformB).m_origin,local_b8,&local_58,&local_38,&local_bc,&local_c0,4,
           in_stack_fffffffffffffee8,in_stack_fffffffffffffef0,output);
  return;
}

Assistant:

void cbtBoxBoxDetector::getClosestPoints(const ClosestPointInput& input, Result& output, class cbtIDebugDraw* /*debugDraw*/, bool /*swapResults*/)
{
	const cbtTransform& transformA = input.m_transformA;
	const cbtTransform& transformB = input.m_transformB;

	int skip = 0;
	dContactGeom* contact = 0;

	dMatrix3 R1;
	dMatrix3 R2;

	for (int j = 0; j < 3; j++)
	{
		R1[0 + 4 * j] = transformA.getBasis()[j].x();
		R2[0 + 4 * j] = transformB.getBasis()[j].x();

		R1[1 + 4 * j] = transformA.getBasis()[j].y();
		R2[1 + 4 * j] = transformB.getBasis()[j].y();

		R1[2 + 4 * j] = transformA.getBasis()[j].z();
		R2[2 + 4 * j] = transformB.getBasis()[j].z();
	}

	cbtVector3 normal;
	cbtScalar depth;
	int return_code;
	int maxc = 4;

	dBoxBox2(transformA.getOrigin(),
			 R1,
			 2.f * m_box1->getHalfExtentsWithMargin(),
			 transformB.getOrigin(),
			 R2,
			 2.f * m_box2->getHalfExtentsWithMargin(),
			 normal, &depth, &return_code,
			 maxc, contact, skip,
			 output);
}